

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool checkhttpprefix(Curl_easy *data,char *s)

{
  char *first;
  _Bool _Var1;
  int iVar2;
  size_t max;
  curl_slist *pcStack_20;
  _Bool rc;
  curl_slist *head;
  char *s_local;
  Curl_easy *data_local;
  
  pcStack_20 = (data->set).http200aliases;
  _Var1 = false;
  do {
    if (pcStack_20 == (curl_slist *)0x0) {
LAB_001210b2:
      if (_Var1 == false) {
        iVar2 = Curl_raw_nequal("HTTP/",s,5);
        if (iVar2 != 0) {
          _Var1 = true;
        }
      }
      return _Var1;
    }
    first = pcStack_20->data;
    max = strlen(pcStack_20->data);
    iVar2 = Curl_raw_nequal(first,s,max);
    if (iVar2 != 0) {
      _Var1 = true;
      goto LAB_001210b2;
    }
    pcStack_20 = pcStack_20->next;
  } while( true );
}

Assistant:

static bool
checkhttpprefix(struct Curl_easy *data,
                const char *s)
{
  struct curl_slist *head = data->set.http200aliases;
  bool rc = FALSE;
#ifdef CURL_DOES_CONVERSIONS
  /* convert from the network encoding using a scratch area */
  char *scratch = strdup(s);
  if(NULL == scratch) {
    failf (data, "Failed to allocate memory for conversion!");
    return FALSE; /* can't return CURLE_OUT_OF_MEMORY so return FALSE */
  }
  if(CURLE_OK != Curl_convert_from_network(data, scratch, strlen(s)+1)) {
    /* Curl_convert_from_network calls failf if unsuccessful */
    free(scratch);
    return FALSE; /* can't return CURLE_foobar so return FALSE */
  }
  s = scratch;
#endif /* CURL_DOES_CONVERSIONS */

  while(head) {
    if(checkprefix(head->data, s)) {
      rc = TRUE;
      break;
    }
    head = head->next;
  }

  if(!rc && (checkprefix("HTTP/", s)))
    rc = TRUE;

#ifdef CURL_DOES_CONVERSIONS
  free(scratch);
#endif /* CURL_DOES_CONVERSIONS */
  return rc;
}